

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
PrintTriedExpectationsLocked
          (FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,
          ArgumentTuple *args,ostream *why)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference this_00;
  ostream *in_RDX;
  ExpectationBase *in_RSI;
  char *pcVar4;
  long in_RDI;
  MutexBase *unaff_retaddr;
  TypedExpectation<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *expectation;
  int i;
  int count;
  ostream *in_stack_00000220;
  ArgumentTuple *in_stack_00000228;
  TypedExpectation<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *in_stack_00000230;
  int local_20;
  
  MutexBase::AssertHeld(unaff_retaddr);
  sVar2 = std::
          vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          ::size((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                  *)(in_RDI + 0x30));
  iVar1 = (int)sVar2;
  poVar3 = std::operator<<(in_RDX,"Google Mock tried the following ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  pcVar4 = "expectations, but none matched";
  if (iVar1 == 1) {
    pcVar4 = "expectation, but it didn\'t match";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,":\n");
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    this_00 = std::
              vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
              ::operator[]((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                            *)(in_RDI + 0x30),(long)local_20);
    linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    std::operator<<(in_RDX,"\n");
    ExpectationBase::DescribeLocationTo((ExpectationBase *)why,_i);
    poVar3 = in_RDX;
    if (1 < iVar1) {
      poVar3 = std::operator<<(in_RDX,"tried expectation #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      std::operator<<(poVar3,": ");
      poVar3 = in_RDX;
    }
    in_RDX = poVar3;
    pcVar4 = ExpectationBase::source_text((ExpectationBase *)0x13ad13);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"...\n");
    TypedExpectation<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::ExplainMatchResultTo
              (in_stack_00000230,in_stack_00000228,in_stack_00000220);
    ExpectationBase::DescribeCallCountTo(in_RSI,in_RDX);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = static_cast<int>(untyped_expectations_.size());
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (int i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }